

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZTensor.h
# Opt level: O0

void __thiscall
TPZTensor<double>::ComputeEigenvector0
          (TPZTensor<double> *this,double *eigenvalue,TPZManVector<double,_3> *eigenvector)

{
  char cVar1;
  double *pdVar2;
  TPZVec<double> *in_RDX;
  double *in_RSI;
  double dVar3;
  double dVar4;
  double number;
  REAL RVar5;
  double inv_sqrt_val_2;
  double inv_sqrt_val_1;
  double inv_sqrt_val;
  int imax;
  REAL dmax;
  double d2;
  double d1;
  double d0;
  TPZManVector<double,_3> r1xr2;
  TPZManVector<double,_3> r0xr2;
  TPZManVector<double,_3> r0xr1;
  TPZManVector<double,_3> row2;
  TPZManVector<double,_3> row1;
  TPZManVector<double,_3> row0;
  TPZManVector<double,_3> *in_stack_fffffffffffffc60;
  TPZVec<double> *in_stack_fffffffffffffc78;
  TPZManVector<double,_3> *in_stack_fffffffffffffc80;
  TPZVec<double> *in_stack_fffffffffffffcb0;
  TPZVec<double> *in_stack_fffffffffffffcb8;
  TPZVec<double> *in_stack_fffffffffffffcc0;
  double local_198;
  TPZVec<double> local_178;
  TPZVec<double> local_140;
  TPZVec<double> local_108;
  TPZVec<double> local_d0;
  TPZVec<double> local_98 [2];
  TPZVec<double> local_50;
  TPZVec<double> *local_18;
  double *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  TPZManVector<double,_3>::TPZManVector
            (in_stack_fffffffffffffc80,(int64_t)in_stack_fffffffffffffc78);
  pdVar2 = XX((TPZTensor<double> *)0x14ab79e);
  dVar3 = *pdVar2;
  dVar4 = *local_10;
  pdVar2 = TPZVec<double>::operator[](&local_50,0);
  *pdVar2 = dVar3 - dVar4;
  pdVar2 = XY((TPZTensor<double> *)0x14ab80a);
  dVar3 = *pdVar2;
  pdVar2 = TPZVec<double>::operator[](&local_50,1);
  *pdVar2 = dVar3;
  pdVar2 = XZ((TPZTensor<double> *)0x14ab867);
  dVar3 = *pdVar2;
  pdVar2 = TPZVec<double>::operator[](&local_50,2);
  *pdVar2 = dVar3;
  TPZManVector<double,_3>::TPZManVector
            (in_stack_fffffffffffffc80,(int64_t)in_stack_fffffffffffffc78);
  pdVar2 = XY((TPZTensor<double> *)0x14ab8d8);
  dVar3 = *pdVar2;
  pdVar2 = TPZVec<double>::operator[](local_98,0);
  *pdVar2 = dVar3;
  pdVar2 = YY((TPZTensor<double> *)0x14ab934);
  dVar3 = *pdVar2;
  dVar4 = *local_10;
  pdVar2 = TPZVec<double>::operator[](local_98,1);
  *pdVar2 = dVar3 - dVar4;
  pdVar2 = YZ((TPZTensor<double> *)0x14ab9a1);
  dVar3 = *pdVar2;
  pdVar2 = TPZVec<double>::operator[](local_98,2);
  *pdVar2 = dVar3;
  TPZManVector<double,_3>::TPZManVector
            (in_stack_fffffffffffffc80,(int64_t)in_stack_fffffffffffffc78);
  pdVar2 = XZ((TPZTensor<double> *)0x14aba12);
  dVar3 = *pdVar2;
  pdVar2 = TPZVec<double>::operator[](&local_d0,0);
  *pdVar2 = dVar3;
  pdVar2 = YZ((TPZTensor<double> *)0x14aba6e);
  dVar3 = *pdVar2;
  pdVar2 = TPZVec<double>::operator[](&local_d0,1);
  *pdVar2 = dVar3;
  pdVar2 = ZZ((TPZTensor<double> *)0x14abacb);
  dVar3 = *pdVar2;
  dVar4 = *local_10;
  pdVar2 = TPZVec<double>::operator[](&local_d0,2);
  *pdVar2 = dVar3 - dVar4;
  TPZManVector<double,_3>::TPZManVector
            (in_stack_fffffffffffffc80,(int64_t)in_stack_fffffffffffffc78);
  Cross<double>(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0);
  TPZManVector<double,_3>::TPZManVector
            (in_stack_fffffffffffffc80,(int64_t)in_stack_fffffffffffffc78);
  Cross<double>(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0);
  TPZManVector<double,_3>::TPZManVector
            (in_stack_fffffffffffffc80,(int64_t)in_stack_fffffffffffffc78);
  Cross<double>(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0);
  dVar3 = Dot<double>(&in_stack_fffffffffffffc80->super_TPZVec<double>,in_stack_fffffffffffffc78);
  dVar4 = Dot<double>(&in_stack_fffffffffffffc80->super_TPZVec<double>,in_stack_fffffffffffffc78);
  number = Dot<double>(&in_stack_fffffffffffffc80->super_TPZVec<double>,in_stack_fffffffffffffc78);
  local_198 = TPZExtractVal::val(dVar3);
  RVar5 = TPZExtractVal::val(dVar4);
  cVar1 = local_198 < RVar5;
  if ((bool)cVar1) {
    local_198 = TPZExtractVal::val(dVar4);
  }
  RVar5 = TPZExtractVal::val(number);
  if (local_198 < RVar5) {
    cVar1 = '\x02';
  }
  if (cVar1 == '\0') {
    dVar4 = sqrt(dVar3);
    dVar4 = 1.0 / dVar4;
    pdVar2 = TPZVec<double>::operator[](&local_108,0);
    dVar3 = *pdVar2;
    pdVar2 = TPZVec<double>::operator[](local_18,0);
    *pdVar2 = dVar3 * dVar4;
    pdVar2 = TPZVec<double>::operator[](&local_108,1);
    dVar3 = *pdVar2;
    pdVar2 = TPZVec<double>::operator[](local_18,1);
    *pdVar2 = dVar3 * dVar4;
    pdVar2 = TPZVec<double>::operator[](&local_108,2);
    dVar3 = *pdVar2;
    pdVar2 = TPZVec<double>::operator[](local_18,2);
    *pdVar2 = dVar3 * dVar4;
  }
  else if (cVar1 == '\x01') {
    dVar4 = sqrt(dVar4);
    dVar4 = 1.0 / dVar4;
    pdVar2 = TPZVec<double>::operator[](&local_140,0);
    dVar3 = *pdVar2;
    pdVar2 = TPZVec<double>::operator[](local_18,0);
    *pdVar2 = dVar3 * dVar4;
    pdVar2 = TPZVec<double>::operator[](&local_140,1);
    dVar3 = *pdVar2 * dVar4;
    pdVar2 = TPZVec<double>::operator[](local_18,1);
    *pdVar2 = dVar3;
    pdVar2 = TPZVec<double>::operator[](&local_140,2);
    dVar3 = *pdVar2;
    pdVar2 = TPZVec<double>::operator[](local_18,2);
    *pdVar2 = dVar3 * dVar4;
  }
  else {
    dVar4 = sqrt(number);
    dVar4 = 1.0 / dVar4;
    pdVar2 = TPZVec<double>::operator[](&local_178,0);
    dVar3 = *pdVar2;
    pdVar2 = TPZVec<double>::operator[](local_18,0);
    *pdVar2 = dVar3 * dVar4;
    pdVar2 = TPZVec<double>::operator[](&local_178,1);
    dVar3 = *pdVar2;
    pdVar2 = TPZVec<double>::operator[](local_18,1);
    *pdVar2 = dVar3 * dVar4;
    pdVar2 = TPZVec<double>::operator[](&local_178,2);
    dVar3 = *pdVar2;
    in_stack_fffffffffffffc60 = (TPZManVector<double,_3> *)TPZVec<double>::operator[](local_18,2);
    (in_stack_fffffffffffffc60->super_TPZVec<double>)._vptr_TPZVec = (_func_int **)(dVar3 * dVar4);
  }
  TPZManVector<double,_3>::~TPZManVector(in_stack_fffffffffffffc60);
  TPZManVector<double,_3>::~TPZManVector(in_stack_fffffffffffffc60);
  TPZManVector<double,_3>::~TPZManVector(in_stack_fffffffffffffc60);
  TPZManVector<double,_3>::~TPZManVector(in_stack_fffffffffffffc60);
  TPZManVector<double,_3>::~TPZManVector(in_stack_fffffffffffffc60);
  TPZManVector<double,_3>::~TPZManVector(in_stack_fffffffffffffc60);
  return;
}

Assistant:

void TPZTensor<T>::ComputeEigenvector0(const T &eigenvalue, TPZManVector<T, 3> &eigenvector) const {
    // Compute a unit-length eigenvector for eigenvalue[i0].  The matrix is
    // rank 2, so two of the rows are linearly independent.  For a robust
    // computation of the eigenvector, select the two rows whose cross product
    // has largest length of all pairs of rows.
    TPZManVector<T, 3> row0(3);
    row0[0] = XX() - eigenvalue;
    row0[1] = XY();
    row0[2] = XZ();
    TPZManVector<T, 3> row1(3);
    row1[0] = XY();
    row1[1] = YY() - eigenvalue;
    row1[2] = YZ();
    TPZManVector<T, 3> row2(3);
    row2[0] = XZ();
    row2[1] = YZ();
    row2[2] = ZZ() - eigenvalue;
    TPZManVector<T, 3> r0xr1(3);
    Cross(row0, row1, r0xr1);
    TPZManVector<T, 3> r0xr2(3);
    Cross(row0, row2, r0xr2);
    TPZManVector<T, 3> r1xr2(3);
    Cross(row1, row2, r1xr2);
    T d0 = Dot(r0xr1, r0xr1);
    T d1 = Dot(r0xr2, r0xr2);
    T d2 = Dot(r1xr2, r1xr2);

    REAL dmax = TPZExtractVal::val(d0);
    int imax = 0;
    if (TPZExtractVal::val(d1) > dmax) {
        dmax = TPZExtractVal::val(d1);
        imax = 1;
    }
    if (TPZExtractVal::val(d2) > dmax) {
        imax = 2;
    }

    if (imax == 0) {
        T inv_sqrt_val = 1. / sqrt(d0);
        eigenvector[0] = r0xr1[0] * inv_sqrt_val;
        eigenvector[1] = r0xr1[1] * inv_sqrt_val;
        eigenvector[2] = r0xr1[2] * inv_sqrt_val;
    } else if (imax == 1) {
        T inv_sqrt_val = 1. / sqrt(d1);
        eigenvector[0] = r0xr2[0] * inv_sqrt_val;
        eigenvector[1] = r0xr2[1] * inv_sqrt_val;
        eigenvector[2] = r0xr2[2] * inv_sqrt_val;
    } else {
        T inv_sqrt_val = 1. / sqrt(d2);
        eigenvector[0] = r1xr2[0] * inv_sqrt_val;
        eigenvector[1] = r1xr2[1] * inv_sqrt_val;
        eigenvector[2] = r1xr2[2] * inv_sqrt_val;
    }
}